

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarianceSwapsHestonAnalyticalPricer.cpp
# Opt level: O2

double __thiscall
VarianceSwapsHestonAnalyticalPricer::price
          (VarianceSwapsHestonAnalyticalPricer *this,VarianceSwap *varianceSwap)

{
  size_t i;
  ulong uVar1;
  double dVar2;
  double dVar3;
  vector<double,_std::allocator<double>_> dates;
  
  VarianceSwap::getDates(&dates,varianceSwap);
  dVar2 = u1Term(this,*dates.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start,
                 dates.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[1]);
  dVar2 = dVar2 + 0.0;
  uVar1 = 2;
  while( true ) {
    if ((ulong)((long)dates.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)dates.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= uVar1) break;
    dVar3 = uiTerm(this,dates.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar1 - 1],
                   dates.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar1]);
    dVar2 = dVar2 + dVar3;
    uVar1 = uVar1 + 1;
  }
  dVar3 = dates.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish[-1];
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&dates.super__Vector_base<double,_std::allocator<double>_>);
  return (dVar2 * 10000.0) / dVar3;
}

Assistant:

double VarianceSwapsHestonAnalyticalPricer::price(const VarianceSwap& varianceSwap) const{
    double price=0;
    std::vector<double> dates = varianceSwap.getDates();

    price = price + u1Term(dates[0],dates[1]);
    for (std::size_t i = 2; i < dates.size(); i++)
    {   
        // std::cout << uiTerm(dates[i-1],dates[i]) << std::endl;
        price = price + uiTerm(dates[i-1],dates[i]);
    }
    price = price * 10000. / dates.back();
    return price;
}